

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void ParseLine(bool parselabels)

{
  bool bVar1;
  int iVar2;
  char *local_18;
  char *srcNonWhiteChar;
  bool parselabels_local;
  
  srcNonWhiteChar._7_1_ = parselabels;
  iVar2 = PrepareLine();
  if (iVar2 == 0) {
    if ((eolComment != (char *)0x0) && (bVar1 = IsSldExportActive(), bVar1)) {
      SldTrackComments();
    }
    if (*lp == '\0') {
      local_18 = line;
      SkipBlanks(&local_18);
      if ((*local_18 == ';') || ((*local_18 == '/' && (local_18[1] == '/')))) {
        local_18 = lp;
      }
      if ((*local_18 == '\0') && (comlin == 0)) {
        ListFile(false);
      }
      else {
        ListFile(true);
      }
    }
    else {
      if ((srcNonWhiteChar._7_1_ & 1) != 0) {
        ParseLabel();
      }
      iVar2 = SkipBlanks();
      if (iVar2 == 0) {
        ParseMacro();
      }
      iVar2 = SkipBlanks();
      if (iVar2 == 0) {
        ParseInstruction();
      }
      iVar2 = SkipBlanks();
      if (iVar2 == 0) {
        Error("Unexpected",lp,PASS3);
      }
      ListFile(false);
    }
  }
  return;
}

Assistant:

void ParseLine(bool parselabels) {
	if (PrepareLine()) return;

	if (eolComment && IsSldExportActive()) SldTrackComments();

	if (!*lp) {
		char *srcNonWhiteChar = line;
		SkipBlanks(srcNonWhiteChar);
		// check if only "end-line" comment remained, treat that one as "empty" line too
		if (';' == srcNonWhiteChar[0] || ('/' == srcNonWhiteChar[0] && '/' == srcNonWhiteChar[1]))
			srcNonWhiteChar = lp;			// force srcNonWhiteChar to point to 0
		if (*srcNonWhiteChar || comlin) {	// non-empty source line turned into nothing
			ListFile(true);					// or empty source inside comment-block -> "skipped"
		} else {
			ListFile();						// empty source line outside of block-comment -> "normal"
		}
		return;
	}

	if (parselabels) ParseLabel();
	if (!SkipBlanks()) ParseMacro();
	if (!SkipBlanks()) ParseInstruction();
	if (!SkipBlanks()) Error("Unexpected", lp);
	ListFile();
}